

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManCreateGate(Gia_Man_t *pNew,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj_00;
  int i;
  
  iVar1 = Vec_IntPop(vSuper);
  iVar2 = Vec_IntPop(vSuper);
  iVar3 = Gia_ObjIsXor(pObj);
  if (iVar3 == 0) {
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
  }
  else if (pNew->pMuxes == (uint *)0x0) {
    iVar1 = Gia_ManHashXor(pNew,iVar1,iVar2);
  }
  else {
    iVar1 = Gia_ManHashXorReal(pNew,iVar1,iVar2);
  }
  Vec_IntPush(vSuper,iVar1);
  iVar1 = Abc_Lit2Var(iVar1);
  pObj_00 = Gia_ManObj(pNew,iVar1);
  Gia_ObjSetGateLevel(pNew,pObj_00);
  iVar1 = vSuper->nSize;
  while( true ) {
    if (iVar1 < 2) {
      return;
    }
    iVar2 = Vec_IntEntry(vSuper,iVar1 + -1);
    i = iVar1 + -2;
    iVar3 = Vec_IntEntry(vSuper,i);
    iVar4 = Abc_Lit2Var(iVar2);
    iVar4 = Gia_ObjLevelId(pNew,iVar4);
    iVar5 = Abc_Lit2Var(iVar3);
    iVar5 = Gia_ObjLevelId(pNew,iVar5);
    if (iVar4 <= iVar5) break;
    iVar1 = iVar1 + -1;
    Vec_IntWriteEntry(vSuper,iVar1,iVar3);
    Vec_IntWriteEntry(vSuper,i,iVar2);
  }
  return;
}

Assistant:

void Gia_ManCreateGate( Gia_Man_t * pNew, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    int iLit0 = Vec_IntPop(vSuper);
    int iLit1 = Vec_IntPop(vSuper);
//    int iLit1 = Gia_ManFindSharedNode(pNew, vSuper, iLit0);
    int iLit, i;
    if ( !Gia_ObjIsXor(pObj) )
        iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    else if ( pNew->pMuxes )
        iLit = Gia_ManHashXorReal( pNew, iLit0, iLit1 );
    else 
        iLit = Gia_ManHashXor( pNew, iLit0, iLit1 );
    Vec_IntPush( vSuper, iLit );
    Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(iLit)) );
    // shift to the corrent location
    for ( i = Vec_IntSize(vSuper)-1; i > 0; i-- )
    {
        int iLit1 = Vec_IntEntry(vSuper, i);
        int iLit2 = Vec_IntEntry(vSuper, i-1);
        if ( Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit1)) <= Gia_ObjLevelId(pNew, Abc_Lit2Var(iLit2)) )
            break;
        Vec_IntWriteEntry( vSuper, i,   iLit2 );
        Vec_IntWriteEntry( vSuper, i-1, iLit1 );
    }
}